

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v8::detail::
for_each_codepoint<fmt::v8::detail::compute_width(fmt::v8::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  detail *ptr;
  char *pcVar1;
  type size;
  size_t __n;
  char *pcVar2;
  anon_class_8_1_54a39806 decode;
  char buf [7];
  count_code_points local_38;
  char local_30 [8];
  
  local_38.count = (size_t *)s.size_;
  pcVar2 = s.data_;
  ptr = this;
  if (pcVar2 < (char *)0x4) {
LAB_00134a28:
    __n = (long)(this + (long)pcVar2) - (long)ptr;
    if (__n != 0) {
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[0] = '\0';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      memcpy(local_30,ptr,__n);
      pcVar2 = local_30;
      do {
        pcVar1 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                           ((anon_class_8_1_54a39806 *)&local_38,pcVar2,(char *)ptr);
        if (pcVar1 == (char *)0x0) {
          return;
        }
        ptr = ptr + ((long)pcVar1 - (long)pcVar2);
        pcVar2 = pcVar1;
      } while ((long)pcVar1 - (long)local_30 < (long)__n);
    }
  }
  else {
    do {
      if (this + (long)pcVar2 + -3 <= ptr) goto LAB_00134a28;
      ptr = (detail *)
            for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                      ((anon_class_8_1_54a39806 *)&local_38,(char *)ptr,(char *)ptr);
    } while (ptr != (detail *)0x0);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, to_unsigned(end - buf_ptr)));
    return result ? end : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}